

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.hpp
# Opt level: O1

void __thiscall SoapySDR::Device::writeSetting<char_const*>(Device *this,string *key,char **value)

{
  allocator local_39;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  std::__cxx11::string::string((string *)local_38,*value,&local_39);
  (*this->_vptr_Device[0x66])(this,key,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return;
}

Assistant:

void SoapySDR::Device::writeSetting(const std::string &key, const Type &value)
{
    this->writeSetting(key, SoapySDR::SettingToString(value));
}